

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPt___char_const>_kj__String_kj__ArrayPtr<char_const>_kj__CappedArray<char,14ul>_kj__ArrayPtr<char_const>>
          (StringTree *this,long pos,size_t branchIndex,StringTree *first,
          NoInfer<kj::ArrayPtr<const_char>_> *rest,NoInfer<kj::ArrayPtr<const_char>_> *rest_1,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_2,NoInfer<kj::ArrayPtr<const_char>_> *rest_3,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_4,NoInfer<kj::ArrayPtr<const_char>_> *rest_5,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_6,NoInfer<kj::CappedArray<char,_14UL>_> *rest_7,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_8,NoInfer<kj::StringTree> *rest_9,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_10,NoInfer<kj::ArrayPtr<const_char>_> *rest_11,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_12,NoInfer<kj::ArrayPtr<const_char>_> *rest_13,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_14,NoInfer<kj::ArrayPtr<const_char>_> *rest_15,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_16,NoInfer<kj::CappedArray<char,_14UL>_> *rest_17
          ,NoInfer<kj::ArrayPtr<const_char>_> *rest_18,NoInfer<kj::StringTree> *rest_19,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_20,NoInfer<kj::String> *rest_21,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_22,NoInfer<kj::ArrayPtr<const_char>_> *rest_23,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_24,NoInfer<kj::ArrayPtr<const_char>_> *rest_25,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_26,NoInfer<kj::ArrayPtr<const_char>_> *rest_27,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_28,NoInfer<kj::String> *rest_29,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_30,NoInfer<kj::CappedArray<char,_14UL>_> *rest_31
          ,NoInfer<kj::ArrayPtr<const_char>_> *rest_32,NoInfer<kj::StringTree> *rest_33,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_34,NoInfer<kj::String> *rest_35,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_36,NoInfer<kj::ArrayPtr<const_char>_> *rest_37,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_38,NoInfer<kj::ArrayPtr<const_char>_> *rest_39,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_40,NoInfer<kj::ArrayPtr<const_char>_> *rest_41,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_42,NoInfer<kj::String> *rest_43,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_44,NoInfer<kj::CappedArray<char,_14UL>_> *rest_45
          ,NoInfer<kj::ArrayPtr<const_char>_> *rest_46,NoInfer<kj::StringTree> *rest_47,
          NoInfer<kj::StringTree> *rest_48,NoInfer<kj::ArrayPtr<const_char>_> *rest_49,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_50,NoInfer<kj::ArrayPtr<const_char>_> *rest_51,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_52,NoInfer<kj::ArrayPtr<const_char>_> *rest_53,
          NoInfer<kj::String> *rest_54,NoInfer<kj::ArrayPtr<const_char>_> *rest_55,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_56,NoInfer<kj::ArrayPtr<const_char>_> *rest_57,
          NoInfer<kj::String> *rest_58,NoInfer<kj::ArrayPtr<const_char>_> *rest_59,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_60,NoInfer<kj::ArrayPtr<const_char>_> *rest_61
          ,NoInfer<kj::StringTree> *rest_62,NoInfer<kj::ArrayPtr<const_char>_> *rest_63)

{
  char *pcVar1;
  Branch *pBVar2;
  StringTree *pSVar3;
  ArrayPtr<const_char> *pAVar4;
  ArrayPtr<const_char> *pAVar5;
  ArrayPtr<const_char> *pAVar6;
  ArrayPtr<const_char> *pAVar7;
  ArrayPtr<const_char> *pAVar8;
  ArrayPtr<const_char> *pAVar9;
  ArrayPtr<const_char> *pAVar10;
  CappedArray<char,_14UL> *pCVar11;
  ArrayPtr<const_char> *pAVar12;
  ArrayPtr<const_char> *pAVar13;
  ArrayPtr<const_char> *pAVar14;
  ArrayPtr<const_char> *pAVar15;
  ArrayPtr<const_char> *pAVar16;
  ArrayPtr<const_char> *pAVar17;
  ArrayPtr<const_char> *pAVar18;
  ArrayPtr<const_char> *pAVar19;
  CappedArray<char,_14UL> *pCVar20;
  ArrayPtr<const_char> *pAVar21;
  StringTree *pSVar22;
  ArrayPtr<const_char> *pAVar23;
  String *pSVar24;
  ArrayPtr<const_char> *pAVar25;
  ArrayPtr<const_char> *pAVar26;
  ArrayPtr<const_char> *pAVar27;
  ArrayPtr<const_char> *pAVar28;
  ArrayPtr<const_char> *pAVar29;
  ArrayPtr<const_char> *pAVar30;
  ArrayPtr<const_char> *pAVar31;
  String *pSVar32;
  ArrayPtr<const_char> *pAVar33;
  CappedArray<char,_14UL> *pCVar34;
  ArrayPtr<const_char> *pAVar35;
  StringTree *pSVar36;
  ArrayPtr<const_char> *pAVar37;
  String *pSVar38;
  ArrayPtr<const_char> *pAVar39;
  ArrayPtr<const_char> *pAVar40;
  ArrayPtr<const_char> *pAVar41;
  ArrayPtr<const_char> *pAVar42;
  ArrayPtr<const_char> *pAVar43;
  ArrayPtr<const_char> *pAVar44;
  ArrayPtr<const_char> *pAVar45;
  String *pSVar46;
  ArrayPtr<const_char> *pAVar47;
  CappedArray<char,_14UL> *pCVar48;
  ArrayPtr<const_char> *pAVar49;
  StringTree *pSVar50;
  StringTree *pSVar51;
  ArrayPtr<const_char> *pAVar52;
  ArrayPtr<const_char> *pAVar53;
  ArrayPtr<const_char> *pAVar54;
  ArrayPtr<const_char> *pAVar55;
  ArrayPtr<const_char> *pAVar56;
  String *pSVar57;
  ArrayPtr<const_char> *pAVar58;
  ArrayPtr<const_char> *pAVar59;
  ArrayPtr<const_char> *pAVar60;
  String *pSVar61;
  ArrayPtr<const_char> *pAVar62;
  CappedArray<char,_14UL> *pCVar63;
  ArrayPtr<const_char> *pAVar64;
  StringTree *pSVar65;
  ArrayPtr<const_char> *pAVar66;
  ArrayPtr<const_char> *pAVar67;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000001f8;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000200;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000208;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000210;
  NoInfer<kj::String> *in_stack_00000218;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000220;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000228;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000230;
  NoInfer<kj::String> *in_stack_00000238;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000240;
  NoInfer<kj::CappedArray<char,_14UL>_> *in_stack_00000248;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000250;
  NoInfer<kj::StringTree> *in_stack_00000258;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000260;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000268;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000270;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000278;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000280;
  NoInfer<kj::String> *in_stack_00000288;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000290;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000298;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002a0;
  NoInfer<kj::String> *in_stack_000002a8;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002b0;
  NoInfer<kj::CappedArray<char,_14UL>_> *in_stack_000002b8;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002c0;
  NoInfer<kj::StringTree> *in_stack_000002c8;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002d0;
  NoInfer<kj::String> *in_stack_000002d8;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002e0;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002e8;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002f0;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002f8;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000300;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000308;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000310;
  NoInfer<kj::String> *in_stack_00000318;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000320;
  NoInfer<kj::CappedArray<char,_14UL>_> *in_stack_00000328;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000330;
  ArrayPtr<const_char> *rest_local_1;
  ArrayPtr<const_char> *rest_local;
  StringTree *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  pcVar1 = String::begin(&this->text);
  pBVar2 = Array<kj::StringTree::Branch>::operator[](&this->branches,branchIndex);
  pBVar2->index = pos - (long)pcVar1;
  pSVar3 = mv<kj::StringTree>(first);
  pBVar2 = Array<kj::StringTree::Branch>::operator[](&this->branches,branchIndex);
  operator=(&pBVar2->content,pSVar3);
  pAVar4 = fwd<kj::ArrayPtr<char_const>>(rest);
  pAVar5 = fwd<kj::ArrayPtr<char_const>>(rest_1);
  pAVar6 = fwd<kj::ArrayPtr<char_const>>(rest_2);
  pAVar7 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  pAVar8 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  pAVar9 = fwd<kj::ArrayPtr<char_const>>(rest_5);
  pAVar10 = fwd<kj::ArrayPtr<char_const>>(rest_6);
  pCVar11 = fwd<kj::CappedArray<char,14ul>>(rest_7);
  pAVar12 = fwd<kj::ArrayPtr<char_const>>(rest_8);
  pSVar3 = fwd<kj::StringTree>(rest_9);
  pAVar13 = fwd<kj::ArrayPtr<char_const>>(rest_10);
  pAVar14 = fwd<kj::ArrayPtr<char_const>>(rest_11);
  pAVar15 = fwd<kj::ArrayPtr<char_const>>(rest_12);
  pAVar16 = fwd<kj::ArrayPtr<char_const>>(rest_13);
  pAVar17 = fwd<kj::ArrayPtr<char_const>>(rest_14);
  pAVar18 = fwd<kj::ArrayPtr<char_const>>(rest_15);
  pAVar19 = fwd<kj::ArrayPtr<char_const>>(rest_16);
  pCVar20 = fwd<kj::CappedArray<char,14ul>>(rest_17);
  pAVar21 = fwd<kj::ArrayPtr<char_const>>(rest_18);
  pSVar22 = fwd<kj::StringTree>(rest_19);
  pAVar23 = fwd<kj::ArrayPtr<char_const>>(rest_20);
  pSVar24 = fwd<kj::String>(rest_21);
  pAVar25 = fwd<kj::ArrayPtr<char_const>>(rest_22);
  pAVar26 = fwd<kj::ArrayPtr<char_const>>(rest_23);
  pAVar27 = fwd<kj::ArrayPtr<char_const>>(rest_24);
  pAVar28 = fwd<kj::ArrayPtr<char_const>>(rest_25);
  pAVar29 = fwd<kj::ArrayPtr<char_const>>(rest_26);
  pAVar30 = fwd<kj::ArrayPtr<char_const>>(rest_27);
  pAVar31 = fwd<kj::ArrayPtr<char_const>>(rest_28);
  pSVar32 = fwd<kj::String>(rest_29);
  pAVar33 = fwd<kj::ArrayPtr<char_const>>(rest_30);
  pCVar34 = fwd<kj::CappedArray<char,14ul>>(rest_31);
  pAVar35 = fwd<kj::ArrayPtr<char_const>>(rest_32);
  pSVar36 = fwd<kj::StringTree>(rest_33);
  pAVar37 = fwd<kj::ArrayPtr<char_const>>(rest_34);
  pSVar38 = fwd<kj::String>(rest_35);
  pAVar39 = fwd<kj::ArrayPtr<char_const>>(rest_36);
  pAVar40 = fwd<kj::ArrayPtr<char_const>>(rest_37);
  pAVar41 = fwd<kj::ArrayPtr<char_const>>(rest_38);
  pAVar42 = fwd<kj::ArrayPtr<char_const>>(rest_39);
  pAVar43 = fwd<kj::ArrayPtr<char_const>>(rest_40);
  pAVar44 = fwd<kj::ArrayPtr<char_const>>(rest_41);
  pAVar45 = fwd<kj::ArrayPtr<char_const>>(rest_42);
  pSVar46 = fwd<kj::String>(rest_43);
  pAVar47 = fwd<kj::ArrayPtr<char_const>>(rest_44);
  pCVar48 = fwd<kj::CappedArray<char,14ul>>(rest_45);
  pAVar49 = fwd<kj::ArrayPtr<char_const>>(rest_46);
  pSVar50 = fwd<kj::StringTree>(rest_47);
  pSVar51 = fwd<kj::StringTree>(rest_48);
  pAVar52 = fwd<kj::ArrayPtr<char_const>>(rest_49);
  pAVar53 = fwd<kj::ArrayPtr<char_const>>(rest_50);
  pAVar54 = fwd<kj::ArrayPtr<char_const>>(rest_51);
  pAVar55 = fwd<kj::ArrayPtr<char_const>>(rest_52);
  pAVar56 = fwd<kj::ArrayPtr<char_const>>(rest_53);
  pSVar57 = fwd<kj::String>(rest_54);
  pAVar58 = fwd<kj::ArrayPtr<char_const>>(rest_55);
  pAVar59 = fwd<kj::ArrayPtr<char_const>>(rest_56);
  pAVar60 = fwd<kj::ArrayPtr<char_const>>(rest_57);
  pSVar61 = fwd<kj::String>(rest_58);
  pAVar62 = fwd<kj::ArrayPtr<char_const>>(rest_59);
  pCVar63 = fwd<kj::CappedArray<char,14ul>>(rest_60);
  pAVar64 = fwd<kj::ArrayPtr<char_const>>(rest_61);
  pSVar65 = fwd<kj::StringTree>(rest_62);
  pAVar66 = fwd<kj::ArrayPtr<char_const>>(rest_63);
  pAVar67 = fwd<kj::ArrayPtr<char_const>>(in_stack_000001f8);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000200);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000208);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000210);
  fwd<kj::String>(in_stack_00000218);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000220);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000228);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000230);
  fwd<kj::String>(in_stack_00000238);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000240);
  fwd<kj::CappedArray<char,14ul>>(in_stack_00000248);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000250);
  fwd<kj::StringTree>(in_stack_00000258);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000260);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000268);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000270);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000278);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000280);
  fwd<kj::String>(in_stack_00000288);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000290);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000298);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002a0);
  fwd<kj::String>(in_stack_000002a8);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002b0);
  fwd<kj::CappedArray<char,14ul>>(in_stack_000002b8);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002c0);
  fwd<kj::StringTree>(in_stack_000002c8);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002d0);
  fwd<kj::String>(in_stack_000002d8);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002e0);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002e8);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002f0);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002f8);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000300);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000308);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000310);
  fwd<kj::String>(in_stack_00000318);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000320);
  fwd<kj::CappedArray<char,14ul>>(in_stack_00000328);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000330);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPt___char_const>_kj__String_kj__ArrayPtr<char_const>_kj__CappedArray<char,14ul>_kj__ArrayPtr<char_const>>
            (this,pos,branchIndex + 1,pAVar4,pAVar5,pAVar6,pAVar7,pAVar8,pAVar9,pAVar10,pCVar11,
             pAVar12,pSVar3,pAVar13,pAVar14,pAVar15,pAVar16,pAVar17,pAVar18,pAVar19,pCVar20,pAVar21,
             pSVar22,pAVar23,pSVar24,pAVar25,pAVar26,pAVar27,pAVar28,pAVar29,pAVar30,pAVar31,pSVar32
             ,pAVar33,pCVar34,pAVar35,pSVar36,pAVar37,pSVar38,pAVar39,pAVar40,pAVar41,pAVar42,
             pAVar43,pAVar44,pAVar45,pSVar46,pAVar47,pCVar48,pAVar49,pSVar50,pSVar51,pAVar52,pAVar53
             ,pAVar54,pAVar55,pAVar56,pSVar57,pAVar58,pAVar59,pAVar60,pSVar61,pAVar62,pCVar63,
             pAVar64,pSVar65,pAVar66,pAVar67);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, StringTree&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = kj::mv(first);
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}